

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

void __thiscall rw::StreamMemory::seek(StreamMemory *this,int32 offset,int32 whence)

{
  if (whence == 1) {
    offset = offset + this->position;
  }
  else if (whence != 0) {
    offset = this->length - offset;
    this->position = offset;
    goto LAB_0010887b;
  }
  this->position = offset;
LAB_0010887b:
  if (this->length < (uint)offset) {
    if (this->capacity < (uint)offset) {
      this->position = 0xffffffff;
      return;
    }
    this->length = offset;
  }
  return;
}

Assistant:

void
StreamMemory::seek(int32 offset, int32 whence)
{
	if(whence == 0)
		this->position = offset;
	else if(whence == 1)
		this->position += offset;
	else
		this->position = this->length-offset;
	if(this->position > this->length){
		// TODO: ideally this would depend on the mode
		if(this->position > this->capacity)
			this->position = S_EOF;
		else
			this->length = this->position;
	}
}